

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::ASL_ZP_X(CPU *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  this->cycles = 6;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 3;
  uVar3 = (uint)(byte)((char)iVar2 + this->X);
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar3);
  this->cycles = this->cycles - 1;
  bVar1 = (byte)iVar2 * '\x02';
  (this->field_6).ps =
       bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7c | (byte)iVar2 >> 7;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar3,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::ASL_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}